

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O2

string * __thiscall
absl::lts_20250127::strings_internal::
JoinAlgorithm<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,void>
          (string *__return_storage_ptr__,strings_internal *this,strings_internal *start,size_t end,
          void *param_5)

{
  size_t sVar1;
  strings_internal *psVar2;
  pointer __dest;
  long lVar3;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  it;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != start) {
    lVar3 = *(long *)this;
    for (psVar2 = this + 0x10; psVar2 != start; psVar2 = psVar2 + 0x10) {
      lVar3 = lVar3 + end + *(size_t *)psVar2;
    }
    if (lVar3 != 0) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
      while( true ) {
        memcpy(__dest,*(void **)(this + 8),*(size_t *)this);
        if (this + 0x10 == start) break;
        sVar1 = *(size_t *)this;
        memcpy(__dest + sVar1,param_5,end);
        __dest = __dest + sVar1 + end;
        this = this + 0x10;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          NoFormatter) {
  std::string result;
  if (start != end) {
    // Sums size
    auto&& start_value = *start;
    // Use uint64_t to prevent size_t overflow. We assume it is not possible for
    // in memory strings to overflow a uint64_t.
    uint64_t result_size = start_value.size();
    for (Iterator it = start; ++it != end;) {
      result_size += s.size();
      result_size += (*it).size();
    }

    if (result_size > 0) {
      constexpr uint64_t kMaxSize =
          uint64_t{(std::numeric_limits<size_t>::max)()};
      ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
      STLStringResizeUninitialized(&result, static_cast<size_t>(result_size));

      // Joins strings
      char* result_buf = &*result.begin();

      memcpy(result_buf, start_value.data(), start_value.size());
      result_buf += start_value.size();
      for (Iterator it = start; ++it != end;) {
        memcpy(result_buf, s.data(), s.size());
        result_buf += s.size();
        auto&& value = *it;
        memcpy(result_buf, value.data(), value.size());
        result_buf += value.size();
      }
    }
  }

  return result;
}